

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_ast_t * mpc_ast_add_root(mpc_ast_t *a)

{
  mpc_ast_t *r;
  
  if (a == (mpc_ast_t *)0x0) {
    r = (mpc_ast_t *)0x0;
  }
  else {
    r = a;
    if (1 < (uint)a->children_num) {
      r = mpc_ast_new(">","");
      mpc_ast_add_child(r,a);
    }
  }
  return r;
}

Assistant:

mpc_ast_t *mpc_ast_add_root(mpc_ast_t *a) {

  mpc_ast_t *r;

  if (a == NULL) { return a; }
  if (a->children_num == 0) { return a; }
  if (a->children_num == 1) { return a; }

  r = mpc_ast_new(">", "");
  mpc_ast_add_child(r, a);
  return r;
}